

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void __thiscall
CVmObjTable::rebuild_image
          (CVmObjTable *this,int meta_dep_idx,CVmImageWriter *writer,CVmConstMapper *mapper)

{
  int trans;
  int pass;
  int in_stack_00000044;
  CVmConstMapper *in_stack_00000048;
  CVmImageWriter *in_stack_00000050;
  int in_stack_0000005c;
  CVmObjTable *in_stack_00000060;
  undefined4 local_24;
  
  for (local_24 = 1; local_24 < 3; local_24 = local_24 + 1) {
    rebuild_image(in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
                  in_stack_00000044);
  }
  return;
}

Assistant:

void CVmObjTable::rebuild_image(VMG_ int meta_dep_idx, CVmImageWriter *writer,
                                class CVmConstMapper *mapper)
{
    int pass;
    
    /* write persistent and transient objects separately */
    for (pass = 1 ; pass <= 2 ; ++pass)
    {
        int trans;

        /* write persistent on pass 1, transient on pass 2 */
        trans = (pass == 2);

        /* write the objects for this pass */
        rebuild_image(vmg_ meta_dep_idx, writer, mapper, trans);
    }
}